

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O2

void nn_recv_loop(nn_options_t *options,int sock)

{
  int iVar1;
  uint buflen;
  void *in_RAX;
  int *piVar2;
  void *buf;
  
  buf = in_RAX;
LAB_00103a51:
  buflen = nn_recv(sock,&buf,0xffffffffffffffff,0);
  if ((int)buflen < 0) goto code_r0x00103a66;
  goto LAB_00103a7e;
code_r0x00103a66:
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  if (iVar1 != 0xb) {
    if ((iVar1 == 0x9523dfe) || (iVar1 == 0x6e)) {
      return;
    }
LAB_00103a7e:
    nn_assert_errno(~buflen >> 0x1f,"Can\'t recv");
    nn_print_message(options,(char *)buf,buflen);
    nn_freemsg(buf);
  }
  goto LAB_00103a51;
}

Assistant:

void nn_recv_loop (nn_options_t *options, int sock)
{
    int rc;
    void *buf;

    for (;;) {
        rc = nn_recv (sock, &buf, NN_MSG, 0);
        if (rc < 0 && errno == EAGAIN) {
            continue;
        } else if (rc < 0 && (errno == ETIMEDOUT || errno == EFSM)) {
            return;  /*  No more messages possible  */
        } else {
            nn_assert_errno (rc >= 0, "Can't recv");
        }
        nn_print_message (options, buf, rc);
        nn_freemsg (buf);
    }
}